

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

ExprBase *
CreateFunctionCallFinal
          (ExpressionContext *ctx,SynBase *source,ExprBase *value,ArrayView<FunctionValue> functions
          ,IntrusiveList<TypeHandle> generics,ArrayView<ArgumentData> arguments,bool allowFailure)

{
  SynBase *pSVar1;
  char *pcVar2;
  char *pcVar3;
  SynIdentifier *pSVar4;
  FunctionData *pFVar5;
  InplaceStr functionName;
  InplaceStr functionName_00;
  FunctionValue proto_00;
  FunctionValue proto_01;
  FunctionValue proto_02;
  FunctionValue proto_03;
  ArrayView<FunctionValue> functions_00;
  ArrayView<FunctionValue> functions_01;
  ArrayView<unsigned_int> ratings_00;
  ArrayView<unsigned_int> ratings_01;
  IntrusiveList<ExprBase> arguments_00;
  IntrusiveList<ExprBase> arguments_01;
  IntrusiveList<ExprBase> arguments_02;
  IntrusiveList<ExprBase> arguments_03;
  IntrusiveList<ExprBase> arguments_04;
  IntrusiveList<ExprBase> arguments_05;
  IntrusiveList<ExprBase> arguments_06;
  IntrusiveList<ExprBase> arguments_07;
  IntrusiveList<ExprBase> arguments_08;
  undefined1 auVar6 [12];
  IntrusiveList<TypeHandle> IVar7;
  ExpressionContext *pEVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ArgumentData *pAVar14;
  ExprPassthrough *pEVar15;
  ExprFunctionCall *pEVar16;
  TypeBase *pTVar17;
  bool_type bVar18;
  ExprBase *pEVar19;
  FunctionValue *pFVar20;
  size_t sVar21;
  uint *puVar22;
  FunctionData **ppFVar23;
  TypeGenericClassProto *pTVar24;
  ExprClassDefinition *pEVar25;
  TypeRef *pTVar26;
  CallArgumentData *pCVar27;
  char *pcVar28;
  ArrayView<ArgumentData> arguments_09;
  ArrayView<CallArgumentData> arguments_10;
  ArrayView<ArgumentData> arguments_11;
  ArrayView<CallArgumentData> arguments_12;
  ArrayView<ArgumentData> arguments_13;
  ArrayView<ArgumentData> arguments_14;
  ArrayView<FunctionValue> functions_02;
  ArrayView<ArgumentData> AVar29;
  ArrayView<ArgumentData> functionArguments_00;
  ArrayView<ArgumentData> functionArguments_01;
  ArrayView<ArgumentData> functionArguments_02;
  ArrayView<ArgumentData> functionArguments_03;
  TypeFunction *local_1360;
  long *local_12f0;
  TypeHandle *expected;
  ExprBase *actual;
  undefined1 local_12d0 [12];
  ExprBase *local_12c0;
  ExprBase *result_3;
  undefined1 local_12b0 [4];
  uint i_12;
  undefined1 local_1280 [8];
  SmallArray<ArgumentData,_32U> callArguments;
  IntrusiveList<SynIdentifier> local_c58;
  ExprBase *local_c48;
  ExprBase *overloads;
  ExprTypeLiteral *typeLiteral_1;
  ExprTypeLiteral *typeLiteral;
  ExprBase *pEStack_c28;
  uint i_11;
  ExprBase *pEStack_c20;
  uint local_c0c;
  undefined1 auStack_c08 [4];
  uint i_10;
  IntrusiveList<ExprBase> errorArguments_3;
  char *messageEnd;
  uint i_9;
  uint i_8;
  char *errPos;
  int iStack_bd8;
  uint errorBufSize;
  char *errorBuf;
  char *messageStart_2;
  undefined1 local_bb8 [12];
  undefined1 local_ba8 [8];
  SmallArray<CallArgumentData,_16U> result_2;
  TypeHandle *local_a60;
  TypeHandle *argType;
  SmallArray<ArgumentData,_8U> functionArguments;
  uint local_8ac;
  uint i_7;
  undefined1 local_898 [12];
  undefined1 local_888 [8];
  SmallArray<CallArgumentData,_16U> result;
  ExprBase *table;
  FunctionValue local_6f8;
  FunctionValue local_6e0;
  ArgumentData *local_6c8;
  undefined8 uStack_6c0;
  TypeHandle *local_6b8;
  TypeHandle *pTStack_6b0;
  FunctionValue local_6a0;
  ExprBase *local_688;
  ExprBase *emptyContext_1;
  ArgumentData *local_668;
  undefined8 uStack_660;
  TypeHandle *local_658;
  TypeHandle *pTStack_650;
  FunctionValue local_640;
  ArgumentData *local_628;
  undefined8 uStack_620;
  TypeHandle *local_618;
  TypeHandle *pTStack_610;
  FunctionValue local_600;
  undefined1 local_5e8 [8];
  FunctionValue instance;
  ExprBase *emptyContext;
  ExprClassDefinition *definition;
  uint k;
  TypeGenericClassProto *proto;
  uint hash;
  FunctionData *el;
  undefined1 auStack_598 [4];
  uint i_6;
  char *local_590;
  char *local_588;
  char *pos;
  InplaceStr baseName;
  FunctionData *function;
  uint local_54c;
  undefined1 auStack_548 [4];
  uint i_5;
  IntrusiveList<ExprBase> errorArguments_2;
  undefined8 uStack_530;
  char *messageStart_1;
  undefined4 local_4d0;
  ArgumentData *local_4c8;
  uint uStack_4c0;
  undefined4 uStack_4bc;
  undefined1 local_4b8 [12];
  undefined1 local_4a8 [8];
  SmallArray<CallArgumentData,_16U> resultB;
  IntrusiveList<MatchData> aliasesB;
  TypeFunction *instanceB;
  undefined4 local_370;
  ArgumentData *local_368;
  uint uStack_360;
  undefined4 uStack_35c;
  undefined1 local_358 [12];
  undefined1 local_348 [8];
  SmallArray<CallArgumentData,_16U> resultA;
  IntrusiveList<MatchData> aliasesA;
  TypeFunction *instanceA;
  uint local_210;
  uint i_4;
  uint i_3;
  uint bestRating;
  uint local_1ec;
  undefined1 auStack_1e8 [4];
  uint i_2;
  IntrusiveList<ExprBase> errorArguments_1;
  undefined8 uStack_1d0;
  char *messageStart;
  ExprBase *result_1;
  undefined1 auStack_138 [8];
  FunctionValue bestOverload;
  SmallArray<unsigned_int,_32U> ratings;
  IntrusiveList<ExprBase> actualArguments;
  TypeFunction *type;
  uint local_5c;
  undefined1 auStack_58 [4];
  uint i_1;
  IntrusiveList<ExprBase> errorArguments;
  TypeHandle *curr;
  uint i;
  bool isErrorCall;
  bool allowFailure_local;
  ExprBase *value_local;
  SynBase *source_local;
  ExpressionContext *ctx_local;
  ArrayView<FunctionValue> functions_local;
  
  ctx_local = (ExpressionContext *)functions.data;
  functions_local.data._0_4_ = functions.count;
  curr._6_1_ = false;
  if (value != (ExprBase *)0x0) {
    curr._6_1_ = isType<TypeError>(value->type);
  }
  for (curr._0_4_ = 0; uVar10 = ArrayView<ArgumentData>::size(&arguments), (uint)curr < uVar10;
      curr._0_4_ = (uint)curr + 1) {
    pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,(uint)curr);
    bVar9 = isType<TypeError>(pAVar14->value->type);
    if (bVar9) {
LAB_001b0d19:
      curr._6_1_ = true;
    }
    else {
      pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,(uint)curr);
      bVar9 = AssertResolvableTypeLiteral(ctx,source,pAVar14->value);
      if (!bVar9) goto LAB_001b0d19;
    }
  }
  for (errorArguments.tail = (ExprBase *)generics.head; errorArguments.tail != (ExprBase *)0x0;
      errorArguments.tail = *(ExprBase **)&(errorArguments.tail)->typeID) {
    bVar9 = isType<TypeError>((TypeBase *)(errorArguments.tail)->_vptr_ExprBase);
    if ((bVar9) ||
       (bVar9 = AssertResolvableType
                          (ctx,source,(TypeBase *)(errorArguments.tail)->_vptr_ExprBase,false),
       !bVar9)) {
      curr._6_1_ = true;
    }
  }
  if (curr._6_1_ != false) {
    IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)auStack_58);
    for (local_5c = 0; uVar10 = ArrayView<ArgumentData>::size(&arguments), local_5c < uVar10;
        local_5c = local_5c + 1) {
      pEVar15 = ExpressionContext::get<ExprPassthrough>(ctx);
      pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,local_5c);
      pSVar1 = pAVar14->value->source;
      pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,local_5c);
      pTVar17 = pAVar14->value->type;
      pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,local_5c);
      ExprPassthrough::ExprPassthrough(pEVar15,pSVar1,pTVar17,pAVar14->value);
      IntrusiveList<ExprBase>::push_back
                ((IntrusiveList<ExprBase> *)auStack_58,&pEVar15->super_ExprBase);
    }
    pEVar16 = ExpressionContext::get<ExprFunctionCall>(ctx);
    pTVar17 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    arguments_08.tail = errorArguments.head;
    arguments_08.head = _auStack_58;
    ExprFunctionCall::ExprFunctionCall(pEVar16,source,pTVar17,value,arguments_08);
    return &pEVar16->super_ExprBase;
  }
  if (value == (ExprBase *)0x0) {
    local_1360 = (TypeFunction *)0x0;
  }
  else {
    local_1360 = getType<TypeFunction>(value->type);
  }
  actualArguments.tail = (ExprBase *)local_1360;
  IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)&ratings.allocator);
  bVar9 = ArrayView<FunctionValue>::empty((ArrayView<FunctionValue> *)&ctx_local);
  _i = (ExprFunctionAccess *)value;
  if (bVar9) {
    if (local_1360 == (TypeFunction *)0x0) {
      bVar9 = isType<ExprTypeLiteral>(value);
      if (((bVar9) && (uVar10 = ArrayView<ArgumentData>::size(&arguments), uVar10 == 1)) &&
         (pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,0),
         pAVar14->name == (SynIdentifier *)0x0)) {
        typeLiteral_1 = getType<ExprTypeLiteral>(value);
        if (typeLiteral_1 != (ExprTypeLiteral *)0x0) {
          bVar9 = isType<TypeGenericClassProto>(typeLiteral_1->value);
          if (bVar9) {
            anon_unknown.dwarf_8df1c::Stop
                      (ctx,source,
                       "ERROR: generic type arguments in <> are not found after constructor name");
          }
          else if ((typeLiteral_1->value->isGeneric & 1U) != 0) {
            anon_unknown.dwarf_8df1c::Stop(ctx,source,"ERROR: can\'t cast to a generic type");
          }
        }
        pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,0);
        pEVar19 = CreateCast(ctx,source,pAVar14->value,(TypeBase *)value[1]._vptr_ExprBase,true);
        return pEVar19;
      }
      overloads = &getType<ExprTypeLiteral>(value)->super_ExprBase;
      if ((ExprTypeLiteral *)overloads != (ExprTypeLiteral *)0x0) {
        bVar9 = isType<TypeGenericClassProto>(((ExprTypeLiteral *)overloads)->value);
        if (bVar9) {
          anon_unknown.dwarf_8df1c::Stop
                    (ctx,source,
                     "ERROR: generic type arguments in <> are not found after constructor name");
        }
        else if ((*(byte *)((long)overloads[1]._vptr_ExprBase + 0x3c) & 1) != 0) {
          anon_unknown.dwarf_8df1c::Stop(ctx,source,"ERROR: can\'t cast to a generic type");
        }
      }
      IntrusiveList<SynIdentifier>::IntrusiveList(&local_c58);
      InplaceStr::InplaceStr((InplaceStr *)&callArguments.allocator,"()");
      local_c48 = CreateVariableAccess(ctx,source,local_c58,stack0xfffffffffffff398,false);
      if (local_c48 == (ExprBase *)0x0) {
        uVar10 = ArrayView<ArgumentData>::size(&arguments);
        anon_unknown.dwarf_8df1c::Report
                  (ctx,source,
                   "ERROR: operator \'()\' accepting %d argument(s) is undefined for a class \'%.*s\'"
                   ,(ulong)uVar10,
                   (ulong)(uint)((int)(value->type->name).end - (int)(value->type->name).begin),
                   (value->type->name).begin);
        pEVar16 = ExpressionContext::get<ExprFunctionCall>(ctx);
        pTVar17 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        arguments_01.tail = actualArguments.head;
        arguments_01.head = (ExprBase *)ratings.allocator;
        ExprFunctionCall::ExprFunctionCall(pEVar16,source,pTVar17,value,arguments_01);
        return &pEVar16->super_ExprBase;
      }
      SmallArray<ArgumentData,_32U>::SmallArray
                ((SmallArray<ArgumentData,_32U> *)local_1280,ctx->allocator);
      ArgumentData::ArgumentData
                ((ArgumentData *)local_12b0,value->source,false,(SynIdentifier *)0x0,value->type,
                 value);
      SmallArray<ArgumentData,_32U>::push_back
                ((SmallArray<ArgumentData,_32U> *)local_1280,(ArgumentData *)local_12b0);
      for (result_3._4_4_ = 0; uVar10 = result_3._4_4_,
          uVar13 = ArrayView<ArgumentData>::size(&arguments), pEVar19 = local_c48, uVar10 < uVar13;
          result_3._4_4_ = result_3._4_4_ + 1) {
        pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,result_3._4_4_);
        SmallArray<ArgumentData,_32U>::push_back
                  ((SmallArray<ArgumentData,_32U> *)local_1280,pAVar14);
      }
      ArrayView<ArgumentData>::ArrayView<32u>
                ((ArrayView<ArgumentData> *)local_12d0,(SmallArray<ArgumentData,_32U> *)local_1280);
      AVar29._12_4_ = 0;
      AVar29.data = (ArgumentData *)local_12d0._0_8_;
      AVar29.count = local_12d0._8_4_;
      local_12c0 = CreateFunctionCall(ctx,source,pEVar19,AVar29,false);
      bVar9 = local_12c0 != (ExprBase *)0x0;
      if (bVar9) {
        functions_local._8_8_ = local_12c0;
      }
      SmallArray<ArgumentData,_32U>::~SmallArray((SmallArray<ArgumentData,_32U> *)local_1280);
      if (bVar9) {
        return (ExprBase *)functions_local._8_8_;
      }
    }
    else {
      if (local_1360->returnType == ctx->typeAuto) {
        anon_unknown.dwarf_8df1c::Report
                  (ctx,source,"ERROR: function type is unresolved at this point");
        pEVar16 = ExpressionContext::get<ExprFunctionCall>(ctx);
        pTVar17 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        functionArguments.allocator = ratings.allocator;
        arguments_03.tail = actualArguments.head;
        arguments_03.head = (ExprBase *)ratings.allocator;
        ExprFunctionCall::ExprFunctionCall(pEVar16,source,pTVar17,value,arguments_03);
        return &pEVar16->super_ExprBase;
      }
      SmallArray<ArgumentData,_8U>::SmallArray
                ((SmallArray<ArgumentData,_8U> *)&argType,ctx->allocator);
      for (local_a60 = (local_1360->arguments).head; local_a60 != (TypeHandle *)0x0;
          local_a60 = local_a60->next) {
        ArgumentData::ArgumentData
                  ((ArgumentData *)&result_2.allocator,(SynBase *)0x0,false,(SynIdentifier *)0x0,
                   local_a60->type,(ExprBase *)0x0);
        SmallArray<ArgumentData,_8U>::push_back
                  ((SmallArray<ArgumentData,_8U> *)&argType,(ArgumentData *)&result_2.allocator);
      }
      SmallArray<CallArgumentData,_16U>::SmallArray
                ((SmallArray<CallArgumentData,_16U> *)local_ba8,ctx->allocator);
      ArrayView<ArgumentData>::ArrayView<8u>
                ((ArrayView<ArgumentData> *)local_bb8,(SmallArray<ArgumentData,_8U> *)&argType);
      AVar29 = arguments;
      arguments_14._12_4_ = 0;
      arguments_14.data = arguments.data;
      arguments_14.count = arguments.count;
      functionArguments_03._12_4_ = 0;
      functionArguments_03.data = (ArgumentData *)local_bb8._0_8_;
      functionArguments_03.count = local_bb8._8_4_;
      arguments = AVar29;
      bVar9 = PrepareArgumentsForFunctionCall
                        (ctx,source,functionArguments_03,arguments_14,
                         (SmallArray<CallArgumentData,_16U> *)local_ba8,(uint *)0x0,true);
      if (bVar9) {
        for (typeLiteral._4_4_ = 0; uVar10 = typeLiteral._4_4_,
            uVar13 = SmallArray<CallArgumentData,_16U>::size
                               ((SmallArray<CallArgumentData,_16U> *)local_ba8), uVar10 < uVar13;
            typeLiteral._4_4_ = typeLiteral._4_4_ + 1) {
          pCVar27 = SmallArray<CallArgumentData,_16U>::operator[]
                              ((SmallArray<CallArgumentData,_16U> *)local_ba8,typeLiteral._4_4_);
          IntrusiveList<ExprBase>::push_back
                    ((IntrusiveList<ExprBase> *)&ratings.allocator,pCVar27->value);
        }
        bVar9 = false;
      }
      else if (allowFailure) {
        functions_local.count = 0;
        functions_local._12_4_ = 0;
        bVar9 = true;
      }
      else {
        if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
          if (ctx->errorCount == 0) {
            ctx->errorPos = (source->pos).begin;
            ctx->errorBufLocation = ctx->errorBuf;
          }
          pcVar2 = ctx->errorBufLocation;
          pcVar28 = ctx->errorBufLocation;
          iVar11 = ctx->errorBufSize + (*(int *)&ctx->errorBuf - *(int *)&ctx->errorBufLocation);
          _i_9 = ctx->errorBufLocation;
          uVar10 = ArrayView<ArgumentData>::size(&arguments);
          uVar13 = SmallArray<ArgumentData,_8U>::size((SmallArray<ArgumentData,_8U> *)&argType);
          iStack_bd8 = (int)pcVar28;
          if (uVar10 == uVar13) {
            iVar12 = NULLC::SafeSprintf(_i_9,(ulong)(uint)(iVar11 + (iStack_bd8 - (int)_i_9)),
                                        "ERROR: there is no conversion from specified arguments and the ones that function accepts\n"
                                       );
          }
          else {
            uVar10 = SmallArray<ArgumentData,_8U>::size((SmallArray<ArgumentData,_8U> *)&argType);
            uVar13 = ArrayView<ArgumentData>::size(&arguments);
            iVar12 = NULLC::SafeSprintf(_i_9,(ulong)(uint)(iVar11 + (iStack_bd8 - (int)_i_9)),
                                        "ERROR: function expects %d argument(s), while %d are supplied\n"
                                        ,(ulong)uVar10,(ulong)uVar13);
          }
          _i_9 = _i_9 + iVar12;
          iVar12 = NULLC::SafeSprintf(_i_9,(ulong)(uint)(iVar11 + (iStack_bd8 - (int)_i_9)),
                                      "\tExpected: (");
          _i_9 = _i_9 + iVar12;
          messageEnd._4_4_ = 0;
          while( true ) {
            uVar10 = SmallArray<ArgumentData,_8U>::size((SmallArray<ArgumentData,_8U> *)&argType);
            if (uVar10 <= messageEnd._4_4_) break;
            pcVar28 = "";
            if (messageEnd._4_4_ != 0) {
              pcVar28 = ", ";
            }
            pAVar14 = SmallArray<ArgumentData,_8U>::operator[]
                                ((SmallArray<ArgumentData,_8U> *)&argType,messageEnd._4_4_);
            pcVar3 = (pAVar14->type->name).end;
            pAVar14 = SmallArray<ArgumentData,_8U>::operator[]
                                ((SmallArray<ArgumentData,_8U> *)&argType,messageEnd._4_4_);
            iVar12 = *(int *)&(pAVar14->type->name).begin;
            pAVar14 = SmallArray<ArgumentData,_8U>::operator[]
                                ((SmallArray<ArgumentData,_8U> *)&argType,messageEnd._4_4_);
            iVar12 = NULLC::SafeSprintf(_i_9,(ulong)(uint)(iVar11 + (iStack_bd8 - (int)_i_9)),
                                        "%s%.*s",pcVar28,(ulong)(uint)((int)pcVar3 - iVar12),
                                        (pAVar14->type->name).begin);
            _i_9 = _i_9 + iVar12;
            messageEnd._4_4_ = messageEnd._4_4_ + 1;
          }
          iVar12 = NULLC::SafeSprintf(_i_9,(ulong)(uint)(iVar11 + (iStack_bd8 - (int)_i_9)),")\n");
          _i_9 = _i_9 + iVar12;
          iVar12 = NULLC::SafeSprintf(_i_9,(ulong)(uint)(iVar11 + (iStack_bd8 - (int)_i_9)),
                                      "\tProvided: (");
          _i_9 = _i_9 + iVar12;
          messageEnd._0_4_ = 0;
          while( true ) {
            uVar10 = ArrayView<ArgumentData>::size(&arguments);
            if (uVar10 <= (uint)messageEnd) break;
            pcVar28 = "";
            if ((uint)messageEnd != 0) {
              pcVar28 = ", ";
            }
            pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,(uint)messageEnd);
            pcVar3 = (pAVar14->type->name).end;
            pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,(uint)messageEnd);
            iVar12 = *(int *)&(pAVar14->type->name).begin;
            pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,(uint)messageEnd);
            iVar12 = NULLC::SafeSprintf(_i_9,(ulong)(uint)(iVar11 + (iStack_bd8 - (int)_i_9)),
                                        "%s%.*s",pcVar28,(ulong)(uint)((int)pcVar3 - iVar12),
                                        (pAVar14->type->name).begin);
            _i_9 = _i_9 + iVar12;
            messageEnd._0_4_ = (uint)messageEnd + 1;
          }
          NULLC::SafeSprintf(_i_9,(ulong)(uint)(iVar11 + (iStack_bd8 - (int)_i_9)),")");
          sVar21 = strlen(ctx->errorBufLocation);
          ctx->errorBufLocation = ctx->errorBufLocation + sVar21;
          errorArguments_3.tail = (ExprBase *)ctx->errorBufLocation;
          anon_unknown.dwarf_8df1c::AddErrorInfoWithLocation
                    (ctx,source,pcVar2,(char *)errorArguments_3.tail);
        }
        if ((ctx->errorHandlerNested & 1U) != 0) {
          if ((ctx->errorHandlerActive & 1U) == 0) {
            __assert_fail("ctx.errorHandlerActive",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x1e4e,
                          "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                         );
          }
          longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
        }
        ctx->errorCount = ctx->errorCount + 1;
        IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)auStack_c08);
        for (local_c0c = 0; uVar10 = local_c0c, uVar13 = ArrayView<ArgumentData>::size(&arguments),
            uVar10 < uVar13; local_c0c = local_c0c + 1) {
          pEVar15 = ExpressionContext::get<ExprPassthrough>(ctx);
          pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,local_c0c);
          pSVar1 = pAVar14->value->source;
          pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,local_c0c);
          pTVar17 = pAVar14->value->type;
          pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,local_c0c);
          ExprPassthrough::ExprPassthrough(pEVar15,pSVar1,pTVar17,pAVar14->value);
          IntrusiveList<ExprBase>::push_back
                    ((IntrusiveList<ExprBase> *)auStack_c08,&pEVar15->super_ExprBase);
        }
        pEVar16 = ExpressionContext::get<ExprFunctionCall>(ctx);
        pTVar17 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        pEStack_c28 = _auStack_c08;
        pEStack_c20 = errorArguments_3.head;
        arguments_02.tail = errorArguments_3.head;
        arguments_02.head = _auStack_c08;
        ExprFunctionCall::ExprFunctionCall(pEVar16,source,pTVar17,value,arguments_02);
        bVar9 = true;
        functions_local._8_8_ = pEVar16;
      }
      SmallArray<CallArgumentData,_16U>::~SmallArray((SmallArray<CallArgumentData,_16U> *)local_ba8)
      ;
      SmallArray<ArgumentData,_8U>::~SmallArray((SmallArray<ArgumentData,_8U> *)&argType);
      if (bVar9) {
        return (ExprBase *)functions_local._8_8_;
      }
    }
    goto LAB_001b3c49;
  }
  SmallArray<unsigned_int,_32U>::SmallArray
            ((SmallArray<unsigned_int,_32U> *)&bestOverload.context,ctx->allocator);
  functions_02.count = (uint)functions_local.data;
  functions_02.data = (FunctionValue *)ctx_local;
  functions_02._12_4_ = 0;
  SelectBestFunction((FunctionValue *)auStack_138,ctx,source,functions_02,generics,arguments,
                     (SmallArray<unsigned_int,_32U> *)&bestOverload.context);
  bVar18 = FunctionValue::operator_cast_to_function_pointer((FunctionValue *)auStack_138);
  if (bVar18 == 0) {
    if (allowFailure) {
      functions_local.count = 0;
      functions_local._12_4_ = 0;
      bVar9 = true;
    }
    else {
      bVar9 = isType<ExprTypeLiteral>(value);
      if ((((bVar9) && (uVar10 = ArrayView<ArgumentData>::size(&arguments), uVar10 == 1)) &&
          (pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,0),
          (TypeStruct *)pAVar14->type == ctx->typeAutoRef)) &&
         (pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,0),
         pAVar14->name == (SynIdentifier *)0x0)) {
        pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,0);
        pEVar19 = CreateCast(ctx,source,pAVar14->value,(TypeBase *)value[1]._vptr_ExprBase,true);
        pFVar20 = ArrayView<FunctionValue>::operator[]((ArrayView<FunctionValue> *)&ctx_local,0);
        bVar9 = isType<ExprNullptrLiteral>(pFVar20->context);
        if (bVar9) {
          bVar9 = true;
          functions_local._8_8_ = pEVar19;
        }
        else {
          pFVar20 = ArrayView<FunctionValue>::operator[]((ArrayView<FunctionValue> *)&ctx_local,0);
          functions_local._8_8_ = CreateAssignment(ctx,source,pFVar20->context,pEVar19);
          bVar9 = true;
        }
      }
      else {
        if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
          if (ctx->errorCount == 0) {
            ctx->errorPos = (source->pos).begin;
            ctx->errorBufLocation = ctx->errorBuf;
          }
          pcVar2 = ctx->errorBufLocation;
          pcVar28 = ctx->errorBufLocation;
          iVar11 = *(int *)&ctx->errorBuf;
          uVar10 = ctx->errorBufSize;
          pFVar20 = ArrayView<FunctionValue>::operator[]((ArrayView<FunctionValue> *)&ctx_local,0);
          pcVar3 = (pFVar20->function->name->name).end;
          pFVar20 = ArrayView<FunctionValue>::operator[]((ArrayView<FunctionValue> *)&ctx_local,0);
          iVar12 = *(int *)&(pFVar20->function->name->name).begin;
          pFVar20 = ArrayView<FunctionValue>::operator[]((ArrayView<FunctionValue> *)&ctx_local,0);
          NULLC::SafeSprintf(pcVar28,(ulong)(uVar10 + (iVar11 - (int)pcVar28)),
                             "ERROR: can\'t find function \'%.*s\' with following arguments:\n",
                             (ulong)(uint)((int)pcVar3 - iVar12),
                             (pFVar20->function->name->name).begin);
          sVar21 = strlen(ctx->errorBufLocation);
          ctx->errorBufLocation = ctx->errorBufLocation + sVar21;
          pcVar28 = ctx->errorBufLocation;
          iVar11 = *(int *)&ctx->errorBuf;
          uVar10 = ctx->errorBufSize;
          pFVar20 = ArrayView<FunctionValue>::operator[]((ArrayView<FunctionValue> *)&ctx_local,0);
          pEVar8 = ctx_local;
          AVar29 = arguments;
          IVar7 = generics;
          pSVar4 = pFVar20->function->name;
          pcVar3 = (pSVar4->name).end;
          auVar6 = *(undefined1 (*) [12])&pSVar4->name;
          functions_00._12_4_ = functions_local.data._4_4_;
          functions_00.count = (uint)functions_local.data;
          ArrayView<unsigned_int>::ArrayView<32u>
                    ((ArrayView<unsigned_int> *)&errorArguments_1.tail,
                     (SmallArray<unsigned_int,_32U> *)&bestOverload.context);
          functionName.end._4_4_ = (int)((ulong)pcVar3 >> 0x20);
          functionName._0_12_ = auVar6;
          functions_00.data = (FunctionValue *)pEVar8;
          ratings_00._8_8_ = uStack_1d0;
          ratings_00.data = (uint *)errorArguments_1.tail;
          ReportOnFunctionSelectError
                    (ctx,source,pcVar28,uVar10 + (iVar11 - (int)pcVar28),pcVar2,functionName,
                     functions_00,IVar7,AVar29,ratings_00,0xffffffff,true);
          sVar21 = strlen(ctx->errorBufLocation);
          ctx->errorBufLocation = ctx->errorBufLocation + sVar21;
        }
        if ((ctx->errorHandlerNested & 1U) != 0) {
          if ((ctx->errorHandlerActive & 1U) == 0) {
            __assert_fail("ctx.errorHandlerActive",
                          "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                          ,0x1d49,
                          "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                         );
          }
          longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
        }
        ctx->errorCount = ctx->errorCount + 1;
        IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)auStack_1e8);
        for (local_1ec = 0; uVar10 = ArrayView<ArgumentData>::size(&arguments), local_1ec < uVar10;
            local_1ec = local_1ec + 1) {
          pEVar15 = ExpressionContext::get<ExprPassthrough>(ctx);
          pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,local_1ec);
          pSVar1 = pAVar14->value->source;
          pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,local_1ec);
          pTVar17 = pAVar14->value->type;
          pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,local_1ec);
          ExprPassthrough::ExprPassthrough(pEVar15,pSVar1,pTVar17,pAVar14->value);
          IntrusiveList<ExprBase>::push_back
                    ((IntrusiveList<ExprBase> *)auStack_1e8,&pEVar15->super_ExprBase);
        }
        pEVar16 = ExpressionContext::get<ExprFunctionCall>(ctx);
        pTVar17 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        arguments_07.tail = errorArguments_1.head;
        arguments_07.head = _auStack_1e8;
        ExprFunctionCall::ExprFunctionCall(pEVar16,source,pTVar17,value,arguments_07);
        bVar9 = true;
        functions_local._8_8_ = pEVar16;
      }
    }
  }
  else {
    i_4 = 0xffffffff;
    for (local_210 = 0;
        uVar10 = ArrayView<FunctionValue>::size((ArrayView<FunctionValue> *)&ctx_local),
        local_210 < uVar10; local_210 = local_210 + 1) {
      pFVar20 = ArrayView<FunctionValue>::operator[]
                          ((ArrayView<FunctionValue> *)&ctx_local,local_210);
      if (pFVar20->function == (FunctionData *)bestOverload.source) {
        puVar22 = SmallArray<unsigned_int,_32U>::operator[]
                            ((SmallArray<unsigned_int,_32U> *)&bestOverload.context,local_210);
        i_4 = *puVar22;
      }
    }
    instanceA._4_4_ = 0;
LAB_001b1745:
    uVar10 = ArrayView<FunctionValue>::size((ArrayView<FunctionValue> *)&ctx_local);
    if (instanceA._4_4_ < uVar10) {
      pFVar20 = ArrayView<FunctionValue>::operator[]
                          ((ArrayView<FunctionValue> *)&ctx_local,instanceA._4_4_);
      if ((pFVar20->function == (FunctionData *)bestOverload.source) ||
         (puVar22 = SmallArray<unsigned_int,_32U>::operator[]
                              ((SmallArray<unsigned_int,_32U> *)&bestOverload.context,
                               instanceA._4_4_), *puVar22 != i_4)) goto LAB_001b2066;
      bVar9 = isType<TypeAutoRef>((TypeBase *)(bestOverload.function)->scope);
      if (bVar9) {
        pFVar20 = ArrayView<FunctionValue>::operator[]
                            ((ArrayView<FunctionValue> *)&ctx_local,instanceA._4_4_);
        bVar9 = ExpressionContext::IsGenericFunction(ctx,pFVar20->function);
        if ((bVar9) &&
           (bVar9 = ExpressionContext::IsGenericFunction(ctx,(FunctionData *)bestOverload.source),
           bVar9)) {
          aliasesA.tail = (MatchData *)0x0;
          IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&resultA.allocator);
          SmallArray<CallArgumentData,_16U>::SmallArray
                    ((SmallArray<CallArgumentData,_16U> *)local_348,ctx->allocator);
          pFVar20 = ArrayView<FunctionValue>::operator[]
                              ((ArrayView<FunctionValue> *)&ctx_local,instanceA._4_4_);
          ArrayView<ArgumentData>::ArrayView<4u>
                    ((ArrayView<ArgumentData> *)local_358,&pFVar20->function->arguments);
          AVar29 = arguments;
          local_368 = arguments.data;
          uStack_360 = arguments.count;
          uStack_35c = arguments._12_4_;
          arguments_09._12_4_ = 0;
          arguments_09.data = arguments.data;
          arguments_09.count = arguments.count;
          functionArguments_00._12_4_ = 0;
          functionArguments_00.data = (ArgumentData *)local_358._0_8_;
          functionArguments_00.count = local_358._8_4_;
          arguments = AVar29;
          bVar9 = PrepareArgumentsForFunctionCall
                            (ctx,source,functionArguments_00,arguments_09,
                             (SmallArray<CallArgumentData,_16U> *)local_348,(uint *)0x0,false);
          if (bVar9) {
            pFVar20 = ArrayView<FunctionValue>::operator[]
                                ((ArrayView<FunctionValue> *)&ctx_local,instanceA._4_4_);
            pTVar17 = pFVar20->function->scope->ownerType;
            pFVar20 = ArrayView<FunctionValue>::operator[]
                                ((ArrayView<FunctionValue> *)&ctx_local,instanceA._4_4_);
            pFVar5 = pFVar20->function;
            ArrayView<CallArgumentData>::ArrayView<16u>
                      ((ArrayView<CallArgumentData> *)&instanceB,
                       (SmallArray<CallArgumentData,_16U> *)local_348);
            arguments_10._12_4_ = 0;
            arguments_10.data = (CallArgumentData *)instanceB;
            arguments_10.count = local_370;
            aliasesA.tail =
                 (MatchData *)
                 GetGenericFunctionInstanceType
                           (ctx,source,pTVar17,pFVar5,arguments_10,
                            (IntrusiveList<MatchData> *)&resultA.allocator);
          }
          aliasesB.tail = (MatchData *)0x0;
          IntrusiveList<MatchData>::IntrusiveList((IntrusiveList<MatchData> *)&resultB.allocator);
          SmallArray<CallArgumentData,_16U>::SmallArray
                    ((SmallArray<CallArgumentData,_16U> *)local_4a8,ctx->allocator);
          ArrayView<ArgumentData>::ArrayView<4u>
                    ((ArrayView<ArgumentData> *)local_4b8,
                     (SmallArray<ArgumentData,_4U> *)&bestOverload.source[1].next);
          AVar29 = arguments;
          local_4c8 = arguments.data;
          uStack_4c0 = arguments.count;
          uStack_4bc = arguments._12_4_;
          arguments_11._12_4_ = 0;
          arguments_11.data = arguments.data;
          arguments_11.count = arguments.count;
          functionArguments_01._12_4_ = 0;
          functionArguments_01.data = (ArgumentData *)local_4b8._0_8_;
          functionArguments_01.count = local_4b8._8_4_;
          arguments = AVar29;
          bVar9 = PrepareArgumentsForFunctionCall
                            (ctx,source,functionArguments_01,arguments_11,
                             (SmallArray<CallArgumentData,_16U> *)local_4a8,(uint *)0x0,false);
          pSVar1 = bestOverload.source;
          if (bVar9) {
            pTVar17 = *(TypeBase **)((bestOverload.source)->end + 1);
            ArrayView<CallArgumentData>::ArrayView<16u>
                      ((ArrayView<CallArgumentData> *)&messageStart_1,
                       (SmallArray<CallArgumentData,_16U> *)local_4a8);
            arguments_12._12_4_ = 0;
            arguments_12.data = (CallArgumentData *)messageStart_1;
            arguments_12.count = local_4d0;
            aliasesB.tail =
                 (MatchData *)
                 GetGenericFunctionInstanceType
                           (ctx,source,pTVar17,(FunctionData *)pSVar1,arguments_12,
                            (IntrusiveList<MatchData> *)&resultB.allocator);
          }
          if (((aliasesA.tail == (MatchData *)0x0) || (aliasesB.tail == (MatchData *)0x0)) ||
             (aliasesA.tail != aliasesB.tail)) {
            result_1._0_4_ = 0;
          }
          else {
            result_1._0_4_ = 0x13;
          }
          SmallArray<CallArgumentData,_16U>::~SmallArray
                    ((SmallArray<CallArgumentData,_16U> *)local_4a8);
          SmallArray<CallArgumentData,_16U>::~SmallArray
                    ((SmallArray<CallArgumentData,_16U> *)local_348);
          if ((int)result_1 != 0) goto LAB_001b2066;
        }
      }
      if ((ctx->errorBuf != (char *)0x0) && (ctx->errorBufSize != 0)) {
        if (ctx->errorCount == 0) {
          ctx->errorPos = (source->pos).begin;
          ctx->errorBufLocation = ctx->errorBuf;
        }
        pcVar2 = ctx->errorBufLocation;
        NULLC::SafeSprintf(ctx->errorBufLocation,
                           (ulong)(ctx->errorBufSize +
                                  (*(int *)&ctx->errorBuf - (int)ctx->errorBufLocation)),
                           "ERROR: ambiguity, there is more than one overloaded function available for the call:\n"
                          );
        sVar21 = strlen(ctx->errorBufLocation);
        ctx->errorBufLocation = ctx->errorBufLocation + sVar21;
        pcVar28 = ctx->errorBufLocation;
        iVar11 = *(int *)&ctx->errorBuf;
        uVar10 = ctx->errorBufSize;
        pFVar20 = ArrayView<FunctionValue>::operator[]((ArrayView<FunctionValue> *)&ctx_local,0);
        pEVar8 = ctx_local;
        AVar29 = arguments;
        IVar7 = generics;
        pSVar4 = pFVar20->function->name;
        pcVar3 = (pSVar4->name).end;
        auVar6 = *(undefined1 (*) [12])&pSVar4->name;
        functions_01._12_4_ = functions_local.data._4_4_;
        functions_01.count = (uint)functions_local.data;
        ArrayView<unsigned_int>::ArrayView<32u>
                  ((ArrayView<unsigned_int> *)&errorArguments_2.tail,
                   (SmallArray<unsigned_int,_32U> *)&bestOverload.context);
        functionName_00.end._4_4_ = (int)((ulong)pcVar3 >> 0x20);
        functionName_00._0_12_ = auVar6;
        functions_01.data = (FunctionValue *)pEVar8;
        ratings_01._8_8_ = uStack_530;
        ratings_01.data = (uint *)errorArguments_2.tail;
        ReportOnFunctionSelectError
                  (ctx,source,pcVar28,uVar10 + (iVar11 - (int)pcVar28),pcVar2,functionName_00,
                   functions_01,IVar7,AVar29,ratings_01,i_4,true);
        sVar21 = strlen(ctx->errorBufLocation);
        ctx->errorBufLocation = ctx->errorBufLocation + sVar21;
      }
      if ((ctx->errorHandlerNested & 1U) != 0) {
        if ((ctx->errorHandlerActive & 1U) == 0) {
          __assert_fail("ctx.errorHandlerActive",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x1d90,
                        "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                       );
        }
        longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
      }
      ctx->errorCount = ctx->errorCount + 1;
      IntrusiveList<ExprBase>::IntrusiveList((IntrusiveList<ExprBase> *)auStack_548);
      for (local_54c = 0; uVar10 = ArrayView<ArgumentData>::size(&arguments), local_54c < uVar10;
          local_54c = local_54c + 1) {
        pEVar15 = ExpressionContext::get<ExprPassthrough>(ctx);
        pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,local_54c);
        pSVar1 = pAVar14->value->source;
        pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,local_54c);
        pTVar17 = pAVar14->value->type;
        pAVar14 = ArrayView<ArgumentData>::operator[](&arguments,local_54c);
        ExprPassthrough::ExprPassthrough(pEVar15,pSVar1,pTVar17,pAVar14->value);
        IntrusiveList<ExprBase>::push_back
                  ((IntrusiveList<ExprBase> *)auStack_548,&pEVar15->super_ExprBase);
      }
      pEVar16 = ExpressionContext::get<ExprFunctionCall>(ctx);
      pTVar17 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      arguments_06.tail = errorArguments_2.head;
      arguments_06.head = _auStack_548;
      ExprFunctionCall::ExprFunctionCall(pEVar16,source,pTVar17,value,arguments_06);
      bVar9 = true;
      functions_local._8_8_ = pEVar16;
      goto LAB_001b2c3e;
    }
    baseName.end = (char *)bestOverload.source;
    actualArguments.tail =
         (ExprBase *)getType<TypeFunction>((TypeBase *)((bestOverload.source)->pos).end);
    bVar9 = isType<TypeAutoRef>((TypeBase *)(bestOverload.function)->scope);
    if (bVar9) {
      pos = *(char **)(*(long *)&(bestOverload.source)->listed + 0x40);
      baseName.begin = *(char **)(*(long *)&(bestOverload.source)->listed + 0x48);
      if ((*(long *)((bestOverload.source)->end + 1) != 0) &&
         (local_588 = strstr(pos,"::"), local_588 != (char *)0x0)) {
        InplaceStr::InplaceStr((InplaceStr *)auStack_598,local_588 + 2);
        pos = _auStack_598;
        baseName.begin = local_590;
      }
      for (el._4_4_ = 0; uVar10 = SmallArray<FunctionData_*,_128U>::size(&ctx->functions),
          el._4_4_ < uVar10; el._4_4_ = el._4_4_ + 1) {
        ppFVar23 = SmallArray<FunctionData_*,_128U>::operator[](&ctx->functions,el._4_4_);
        pFVar5 = *ppFVar23;
        if ((pFVar5->scope->ownerType != (TypeBase *)0x0) &&
           (((pFVar5->scope->ownerType->isGeneric & 1U) != 0 ||
            (((pFVar5->type->super_TypeBase).isGeneric & 1U) != 0)))) {
          uVar10 = NULLC::StringHashContinue(pFVar5->scope->ownerType->nameHash,"::");
          uVar10 = NULLC::StringHashContinue(uVar10,pos,baseName.begin);
          if (pFVar5->nameHash == uVar10) {
            uVar10 = IntrusiveList<MatchData>::size(&pFVar5->generics);
            uVar13 = IntrusiveList<TypeHandle>::size(&generics);
            if (uVar10 == uVar13) {
              uVar10 = IntrusiveList<TypeHandle>::size(&pFVar5->type->arguments);
              uVar13 = IntrusiveList<TypeHandle>::size
                                 ((IntrusiveList<TypeHandle> *)
                                  (((bestOverload.source)->pos).end + 0x68));
              if (uVar10 == uVar13) {
                pTVar24 = getType<TypeGenericClassProto>(pFVar5->scope->ownerType);
                if (pTVar24 == (TypeGenericClassProto *)0x0) {
                  pEVar19 = &ExpressionContext::get<ExprNullptrLiteral>(ctx)->super_ExprBase;
                  pTVar26 = ExpressionContext::GetReferenceType(ctx,pFVar5->scope->ownerType);
                  ExprNullptrLiteral::ExprNullptrLiteral
                            ((ExprNullptrLiteral *)pEVar19,source,&pTVar26->super_TypeBase);
                  local_688 = pEVar19;
                  FunctionValue::FunctionValue(&local_6a0,source,pFVar5,pEVar19);
                  AVar29 = arguments;
                  local_6b8 = generics.head;
                  pTStack_6b0 = generics.tail;
                  local_6c8 = arguments.data;
                  uStack_6c0._0_4_ = arguments.count;
                  uStack_6c0._4_4_ = arguments._12_4_;
                  proto_02.function._0_4_ = (int)local_6a0.function;
                  proto_02.source = local_6a0.source;
                  proto_02.function._4_4_ = (int)((ulong)local_6a0.function >> 0x20);
                  proto_02.context._0_4_ = (int)local_6a0.context;
                  proto_02.context._4_4_ = (int)((ulong)local_6a0.context >> 0x20);
                  arguments = AVar29;
                  CreateGenericFunctionInstance(&local_6e0,ctx,source,proto_02,generics,AVar29,true)
                  ;
                }
                else {
                  for (definition._4_4_ = 0;
                      uVar10 = IntrusiveList<ExprBase>::size(&pTVar24->instances),
                      definition._4_4_ < uVar10; definition._4_4_ = definition._4_4_ + 1) {
                    pEVar19 = IntrusiveList<ExprBase>::operator[]
                                        (&pTVar24->instances,definition._4_4_);
                    pEVar25 = getType<ExprClassDefinition>(pEVar19);
                    pEVar19 = &ExpressionContext::get<ExprNullptrLiteral>(ctx)->super_ExprBase;
                    pTVar26 = ExpressionContext::GetReferenceType
                                        (ctx,(TypeBase *)pEVar25->classType);
                    ExprNullptrLiteral::ExprNullptrLiteral
                              ((ExprNullptrLiteral *)pEVar19,source,&pTVar26->super_TypeBase);
                    instance.context = pEVar19;
                    if ((*(byte *)(*(long *)((bestOverload.source)->end + 1) + 0x3c) & 1) == 0) {
                      FunctionValue::FunctionValue(&local_640,source,pFVar5,pEVar19);
                      AVar29 = arguments;
                      local_658 = generics.head;
                      pTStack_650 = generics.tail;
                      local_668 = arguments.data;
                      uStack_660._0_4_ = arguments.count;
                      uStack_660._4_4_ = arguments._12_4_;
                      proto_01.function._0_4_ = (int)local_640.function;
                      proto_01.source = local_640.source;
                      proto_01.function._4_4_ = (int)((ulong)local_640.function >> 0x20);
                      proto_01.context._0_4_ = (int)local_640.context;
                      proto_01.context._4_4_ = (int)((ulong)local_640.context >> 0x20);
                      arguments = AVar29;
                      CreateGenericFunctionInstance
                                ((FunctionValue *)&emptyContext_1,ctx,source,proto_01,generics,
                                 AVar29,true);
                    }
                    else {
                      FunctionValue::FunctionValue(&local_600,source,pFVar5,pEVar19);
                      AVar29 = arguments;
                      local_618 = generics.head;
                      pTStack_610 = generics.tail;
                      local_628 = arguments.data;
                      uStack_620._0_4_ = arguments.count;
                      uStack_620._4_4_ = arguments._12_4_;
                      proto_00.function._0_4_ = (int)local_600.function;
                      proto_00.source = local_600.source;
                      proto_00.function._4_4_ = (int)((ulong)local_600.function >> 0x20);
                      proto_00.context._0_4_ = (int)local_600.context;
                      proto_00.context._4_4_ = (int)((ulong)local_600.context >> 0x20);
                      arguments = AVar29;
                      CreateGenericFunctionInstance
                                ((FunctionValue *)local_5e8,ctx,source,proto_00,generics,AVar29,
                                 false);
                      bestOverload.source = instance.source;
                      baseName.end = (char *)instance.source;
                      actualArguments.tail =
                           (ExprBase *)
                           getType<TypeFunction>((TypeBase *)((instance.source)->pos).end);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    bVar9 = ExpressionContext::IsGenericFunction(ctx,(FunctionData *)baseName.end);
    if (bVar9) {
      proto_03.function._0_4_ = (int)bestOverload.source;
      proto_03.source = (SynBase *)auStack_138;
      proto_03.function._4_4_ = (int)((ulong)bestOverload.source >> 0x20);
      proto_03.context._0_4_ = (int)bestOverload.function;
      proto_03.context._4_4_ = (int)((ulong)bestOverload.function >> 0x20);
      CreateGenericFunctionInstance(&local_6f8,ctx,source,proto_03,generics,arguments,false);
      bestOverload.function = (FunctionData *)local_6f8.context;
      auStack_138 = (undefined1  [8])local_6f8.source;
      bestOverload.source = (SynBase *)local_6f8.function;
      bVar18 = FunctionValue::operator_cast_to_function_pointer((FunctionValue *)auStack_138);
      if (bVar18 == 0) {
        pEVar16 = ExpressionContext::get<ExprFunctionCall>(ctx);
        pTVar17 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
        arguments_05.tail = actualArguments.head;
        arguments_05.head = (ExprBase *)ratings.allocator;
        ExprFunctionCall::ExprFunctionCall(pEVar16,source,pTVar17,value,arguments_05);
        bVar9 = true;
        functions_local._8_8_ = pEVar16;
        goto LAB_001b2c3e;
      }
      baseName.end = (char *)bestOverload.source;
      actualArguments.tail =
           (ExprBase *)getType<TypeFunction>((TypeBase *)((bestOverload.source)->pos).end);
    }
    if ((TypeBase *)actualArguments.tail[2]._vptr_ExprBase == ctx->typeAuto) {
      anon_unknown.dwarf_8df1c::Report
                (ctx,source,"ERROR: function type is unresolved at this point");
      pEVar16 = ExpressionContext::get<ExprFunctionCall>(ctx);
      pTVar17 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      arguments_04.tail = actualArguments.head;
      arguments_04.head = (ExprBase *)ratings.allocator;
      ExprFunctionCall::ExprFunctionCall(pEVar16,source,pTVar17,value,arguments_04);
      bVar9 = true;
      functions_local._8_8_ = pEVar16;
    }
    else {
      bVar9 = IsVirtualFunctionCall
                        (ctx,(FunctionData *)baseName.end,(TypeBase *)(bestOverload.function)->scope
                        );
      if (bVar9) {
        pEVar19 = GetFunctionTable(ctx,source,(FunctionData *)bestOverload.source);
        InplaceStr::InplaceStr((InplaceStr *)&result.allocator,"__redirect");
        pEVar19 = CreateFunctionCall2(ctx,source,stack0xfffffffffffff890,
                                      (ExprBase *)bestOverload.function,pEVar19,false,true,true);
        _i = (ExprFunctionAccess *)ExpressionContext::get<ExprTypeCast>(ctx);
        ExprTypeCast::ExprTypeCast
                  ((ExprTypeCast *)_i,source,*(TypeBase **)(baseName.end + 0x28),pEVar19,
                   EXPR_CAST_REINTERPRET);
      }
      else {
        _i = ExpressionContext::get<ExprFunctionAccess>(ctx);
        ExprFunctionAccess::ExprFunctionAccess
                  (_i,(SynBase *)auStack_138,*(TypeBase **)(baseName.end + 0x28),
                   (FunctionData *)baseName.end,(ExprBase *)bestOverload.function);
      }
      SmallArray<CallArgumentData,_16U>::SmallArray
                ((SmallArray<CallArgumentData,_16U> *)local_888,ctx->allocator);
      ArrayView<ArgumentData>::ArrayView<4u>
                ((ArrayView<ArgumentData> *)local_898,
                 (SmallArray<ArgumentData,_4U> *)(baseName.end + 0x70));
      AVar29 = arguments;
      arguments_13._12_4_ = 0;
      arguments_13.data = arguments.data;
      arguments_13.count = arguments.count;
      functionArguments_02._12_4_ = 0;
      functionArguments_02.data = (ArgumentData *)local_898._0_8_;
      functionArguments_02.count = local_898._8_4_;
      arguments = AVar29;
      PrepareArgumentsForFunctionCall
                (ctx,source,functionArguments_02,arguments_13,
                 (SmallArray<CallArgumentData,_16U> *)local_888,(uint *)0x0,true);
      for (local_8ac = 0;
          uVar10 = SmallArray<CallArgumentData,_16U>::size
                             ((SmallArray<CallArgumentData,_16U> *)local_888), local_8ac < uVar10;
          local_8ac = local_8ac + 1) {
        pCVar27 = SmallArray<CallArgumentData,_16U>::operator[]
                            ((SmallArray<CallArgumentData,_16U> *)local_888,local_8ac);
        IntrusiveList<ExprBase>::push_back
                  ((IntrusiveList<ExprBase> *)&ratings.allocator,pCVar27->value);
      }
      SmallArray<CallArgumentData,_16U>::~SmallArray((SmallArray<CallArgumentData,_16U> *)local_888)
      ;
      bVar9 = false;
    }
  }
LAB_001b2c3e:
  SmallArray<unsigned_int,_32U>::~SmallArray((SmallArray<unsigned_int,_32U> *)&bestOverload.context)
  ;
  if (bVar9) {
    return (ExprBase *)functions_local._8_8_;
  }
LAB_001b3c49:
  if (actualArguments.tail == (ExprBase *)0x0) {
    __assert_fail("type",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1e8b,
                  "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                 );
  }
  if ((actualArguments.tail[1].field_0xc & 1) != 0) {
    anon_unknown.dwarf_8df1c::Stop(ctx,source,"ERROR: generic function call is not supported");
  }
  uVar10 = IntrusiveList<ExprBase>::size((IntrusiveList<ExprBase> *)&ratings.allocator);
  uVar13 = IntrusiveList<TypeHandle>::size
                     ((IntrusiveList<TypeHandle> *)&actualArguments.tail[2].typeID);
  if (uVar10 != uVar13) {
    __assert_fail("actualArguments.size() == type->arguments.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1e90,
                  "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                 );
  }
  expected = (TypeHandle *)ratings.allocator;
  local_12f0 = *(long **)&actualArguments.tail[2].typeID;
  for (; expected != (TypeHandle *)0x0 && local_12f0 != (long *)0x0; expected = expected[1].next) {
    if (expected[1].type != (TypeBase *)*local_12f0) {
      __assert_fail("actual->type == expected->type",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1e97,
                    "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
    local_12f0 = (long *)local_12f0[1];
  }
  if (expected == (TypeHandle *)0x0) {
    if (local_12f0 == (long *)0x0) {
      pEVar16 = ExpressionContext::get<ExprFunctionCall>(ctx);
      arguments_00.tail = actualArguments.head;
      arguments_00.head = (ExprBase *)ratings.allocator;
      ExprFunctionCall::ExprFunctionCall
                (pEVar16,source,(TypeBase *)actualArguments.tail[2]._vptr_ExprBase,
                 &_i->super_ExprBase,arguments_00);
      return &pEVar16->super_ExprBase;
    }
    __assert_fail("expected == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1e9a,
                  "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                 );
  }
  __assert_fail("actual == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                ,0x1e99,
                "ExprBase *CreateFunctionCallFinal(ExpressionContext &, SynBase *, ExprBase *, ArrayView<FunctionValue>, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
               );
LAB_001b2066:
  instanceA._4_4_ = instanceA._4_4_ + 1;
  goto LAB_001b1745;
}

Assistant:

ExprBase* CreateFunctionCallFinal(ExpressionContext &ctx, SynBase *source, ExprBase *value, ArrayView<FunctionValue> functions, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, bool allowFailure)
{
	bool isErrorCall = false;

	if(value)
	{
		if(isType<TypeError>(value->type))
			isErrorCall = true;
	}

	for(unsigned i = 0; i < arguments.size(); i++)
	{
		if(isType<TypeError>(arguments[i].value->type) || !AssertResolvableTypeLiteral(ctx, source, arguments[i].value))
			isErrorCall = true;
	}

	for(TypeHandle *curr = generics.head; curr; curr = curr->next)
	{
		if(isType<TypeError>(curr->type) || !AssertResolvableType(ctx, source, curr->type, false))
			isErrorCall = true;
	}

	if(isErrorCall)
	{
		IntrusiveList<ExprBase> errorArguments;

		for(unsigned i = 0; i < arguments.size(); i++)
			errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

		return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
	}

	TypeFunction *type = value ? getType<TypeFunction>(value->type) : NULL;

	IntrusiveList<ExprBase> actualArguments;

	if(!functions.empty())
	{
		SmallArray<unsigned, 32> ratings(ctx.allocator);

		FunctionValue bestOverload = SelectBestFunction(ctx, source, functions, generics, arguments, ratings);

		// Didn't find an appropriate function
		if(!bestOverload)
		{
			if(allowFailure)
				return NULL;

			// auto ref -> type cast
			if(isType<ExprTypeLiteral>(value) && arguments.size() == 1 && arguments[0].type == ctx.typeAutoRef && !arguments[0].name)
			{
				ExprBase *result = CreateCast(ctx, source, arguments[0].value, ((ExprTypeLiteral*)value)->value, true);

				// If this was a member function call, store to context
				if(!isType<ExprNullptrLiteral>(functions[0].context))
					return CreateAssignment(ctx, source, functions[0].context, result);

				return result;
			}

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				if(ctx.errorCount == 0)
				{
					ctx.errorPos = source->pos.begin;
					ctx.errorBufLocation = ctx.errorBuf;
				}

				const char *messageStart = ctx.errorBufLocation;

				NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: can't find function '%.*s' with following arguments:\n", FMT_ISTR(functions[0].function->name->name));

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, functions[0].function->name->name, functions, generics, arguments, ratings, ~0u, true);

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);
			}

			if(ctx.errorHandlerNested)
			{
				assert(ctx.errorHandlerActive);

				longjmp(ctx.errorHandler, 1);
			}

			ctx.errorCount++;

			IntrusiveList<ExprBase> errorArguments;

			for(unsigned i = 0; i < arguments.size(); i++)
				errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
		}

		unsigned bestRating = ~0u;

		for(unsigned i = 0; i < functions.size(); i++)
		{
			if(functions[i].function == bestOverload.function)
				bestRating = ratings[i];
		}

		// Check if multiple functions share the same rating
		for(unsigned i = 0; i < functions.size(); i++)
		{
			if(functions[i].function != bestOverload.function && ratings[i] == bestRating)
			{
				// For a function call through 'auto ref' it is ok to have the same function signature in different types
				if(isType<TypeAutoRef>(bestOverload.context->type) && ctx.IsGenericFunction(functions[i].function) && ctx.IsGenericFunction(bestOverload.function))
				{
					TypeFunction *instanceA = NULL;
					IntrusiveList<MatchData> aliasesA;
					SmallArray<CallArgumentData, 16> resultA(ctx.allocator);

					// Handle named argument order, default argument values and variadic functions
					if(PrepareArgumentsForFunctionCall(ctx, source, functions[i].function->arguments, arguments, resultA, NULL, false))
						instanceA = GetGenericFunctionInstanceType(ctx, source, functions[i].function->scope->ownerType, functions[i].function, resultA, aliasesA);

					TypeFunction *instanceB = NULL;
					IntrusiveList<MatchData> aliasesB;
					SmallArray<CallArgumentData, 16> resultB(ctx.allocator);

					if(PrepareArgumentsForFunctionCall(ctx, source, bestOverload.function->arguments, arguments, resultB, NULL, false))
						instanceB = GetGenericFunctionInstanceType(ctx, source, bestOverload.function->scope->ownerType, bestOverload.function, resultB, aliasesB);

					if(instanceA && instanceB && instanceA == instanceB)
						continue;
				}

				if(ctx.errorBuf && ctx.errorBufSize)
				{
					if(ctx.errorCount == 0)
					{
						ctx.errorPos = source->pos.begin;
						ctx.errorBufLocation = ctx.errorBuf;
					}

					const char *messageStart = ctx.errorBufLocation;

					NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: ambiguity, there is more than one overloaded function available for the call:\n");

					ctx.errorBufLocation += strlen(ctx.errorBufLocation);

					ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, functions[0].function->name->name, functions, generics, arguments, ratings, bestRating, true);

					ctx.errorBufLocation += strlen(ctx.errorBufLocation);
				}

				if(ctx.errorHandlerNested)
				{
					assert(ctx.errorHandlerActive);

					longjmp(ctx.errorHandler, 1);
				}

				ctx.errorCount++;

				IntrusiveList<ExprBase> errorArguments;

				for(unsigned i = 0; i < arguments.size(); i++)
					errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

				return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
			}
		}

		FunctionData *function = bestOverload.function;

		type = getType<TypeFunction>(function->type);

		if(isType<TypeAutoRef>(bestOverload.context->type))
		{
			InplaceStr baseName = bestOverload.function->name->name;

			if(bestOverload.function->scope->ownerType)
			{
				if(const char *pos = strstr(baseName.begin, "::"))
					baseName = InplaceStr(pos + 2);
			}

			// For function call through 'auto ref', we have to instantiate all matching member functions of generic types
			for(unsigned i = 0; i < ctx.functions.size(); i++)
			{
				FunctionData *el = ctx.functions[i];

				if(!el->scope->ownerType)
					continue;

				if(!el->scope->ownerType->isGeneric && !el->type->isGeneric)
					continue;

				unsigned hash = NULLC::StringHashContinue(el->scope->ownerType->nameHash, "::");

				hash = NULLC::StringHashContinue(hash, baseName.begin, baseName.end);

				if(el->nameHash != hash)
					continue;

				if(el->generics.size() != generics.size())
					continue;

				if(el->type->arguments.size() != bestOverload.function->type->arguments.size())
					continue;

				if(TypeGenericClassProto *proto = getType<TypeGenericClassProto>(el->scope->ownerType))
				{
					for(unsigned k = 0; k < proto->instances.size(); k++)
					{
						ExprClassDefinition *definition = getType<ExprClassDefinition>(proto->instances[k]);

						ExprBase *emptyContext = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, ctx.GetReferenceType(definition->classType));

						if(bestOverload.function->scope->ownerType->isGeneric)
						{
							FunctionValue instance = CreateGenericFunctionInstance(ctx, source, FunctionValue(source, el, emptyContext), generics, arguments, false);

							bestOverload.function = instance.function;

							function = instance.function;

							type = getType<TypeFunction>(function->type);
						}
						else
						{
							CreateGenericFunctionInstance(ctx, source, FunctionValue(source, el, emptyContext), generics, arguments, true);
						}
					}
				}
				else
				{
					ExprBase *emptyContext = new (ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(source, ctx.GetReferenceType(el->scope->ownerType));

					CreateGenericFunctionInstance(ctx, source, FunctionValue(source, el, emptyContext), generics, arguments, true);
				}
			}
		}

		if(ctx.IsGenericFunction(function))
		{
			bestOverload = CreateGenericFunctionInstance(ctx, source, bestOverload, generics, arguments, false);

			if(!bestOverload)
				return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);

			function = bestOverload.function;

			type = getType<TypeFunction>(function->type);
		}

		if(type->returnType == ctx.typeAuto)
		{
			Report(ctx, source, "ERROR: function type is unresolved at this point");

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);
		}

		if(IsVirtualFunctionCall(ctx, function, bestOverload.context->type))
		{
			ExprBase *table = GetFunctionTable(ctx, source, bestOverload.function);

			value = CreateFunctionCall2(ctx, source, InplaceStr("__redirect"), bestOverload.context, table, false, true, true);

			value = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, function->type, value, EXPR_CAST_REINTERPRET);
		}
		else
		{
			value = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, function->type, function, bestOverload.context);
		}

		SmallArray<CallArgumentData, 16> result(ctx.allocator);

		PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, NULL, true);

		for(unsigned i = 0; i < result.size(); i++)
			actualArguments.push_back(result[i].value);
	}
	else if(type)
	{
		if(type->returnType == ctx.typeAuto)
		{
			Report(ctx, source, "ERROR: function type is unresolved at this point");

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);
		}

		SmallArray<ArgumentData, 8> functionArguments(ctx.allocator);

		for(TypeHandle *argType = type->arguments.head; argType; argType = argType->next)
			functionArguments.push_back(ArgumentData(NULL, false, NULL, argType->type, NULL));

		SmallArray<CallArgumentData, 16> result(ctx.allocator);

		if(!PrepareArgumentsForFunctionCall(ctx, source, functionArguments, arguments, result, NULL, true))
		{
			if(allowFailure)
				return NULL;

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				if(ctx.errorCount == 0)
				{
					ctx.errorPos = source->pos.begin;
					ctx.errorBufLocation = ctx.errorBuf;
				}

				const char *messageStart = ctx.errorBufLocation;

				char *errorBuf = ctx.errorBufLocation;
				unsigned errorBufSize = ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf);

				char *errPos = ctx.errorBufLocation;

				if(arguments.size() != functionArguments.size())
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "ERROR: function expects %d argument(s), while %d are supplied\n", functionArguments.size(), arguments.size());
				else
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "ERROR: there is no conversion from specified arguments and the ones that function accepts\n");

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "\tExpected: (");

				for(unsigned i = 0; i < functionArguments.size(); i++)
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(functionArguments[i].type->name));

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")\n");
			
				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "\tProvided: (");

				for(unsigned i = 0; i < arguments.size(); i++)
					errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(arguments[i].type->name));

				errPos += NULLC::SafeSprintf(errPos, errorBufSize - int(errPos - errorBuf), ")");

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				const char *messageEnd = ctx.errorBufLocation;

				AddErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
			}

			if(ctx.errorHandlerNested)
			{
				assert(ctx.errorHandlerActive);

				longjmp(ctx.errorHandler, 1);
			}

			ctx.errorCount++;

			IntrusiveList<ExprBase> errorArguments;

			for(unsigned i = 0; i < arguments.size(); i++)
				errorArguments.push_back(new (ctx.get<ExprPassthrough>()) ExprPassthrough(arguments[i].value->source, arguments[i].value->type, arguments[i].value));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, errorArguments);
		}

		for(unsigned i = 0; i < result.size(); i++)
			actualArguments.push_back(result[i].value);
	}
	else if(isType<ExprTypeLiteral>(value) && arguments.size() == 1 && !arguments[0].name)
	{
		if(ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(value))
		{
			if(isType<TypeGenericClassProto>(typeLiteral->value))
				Stop(ctx, source, "ERROR: generic type arguments in <> are not found after constructor name");
			else if(typeLiteral->value->isGeneric)
				Stop(ctx, source, "ERROR: can't cast to a generic type");
		}

		// Function-style type casts
		return CreateCast(ctx, source, arguments[0].value, ((ExprTypeLiteral*)value)->value, true);
	}
	else
	{
		if(ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(value))
		{
			if(isType<TypeGenericClassProto>(typeLiteral->value))
				Stop(ctx, source, "ERROR: generic type arguments in <> are not found after constructor name");
			else if(typeLiteral->value->isGeneric)
				Stop(ctx, source, "ERROR: can't cast to a generic type");
		}

		// Call operator()
		if(ExprBase *overloads = CreateVariableAccess(ctx, source, IntrusiveList<SynIdentifier>(), InplaceStr("()"), false))
		{
			SmallArray<ArgumentData, 32> callArguments(ctx.allocator);
			callArguments.push_back(ArgumentData(value->source, false, NULL, value->type, value));

			for(unsigned i = 0; i < arguments.size(); i++)
				callArguments.push_back(arguments[i]);

			if(ExprBase *result = CreateFunctionCall(ctx, source, overloads, callArguments, false))
				return result;
		}
		else
		{
			Report(ctx, source, "ERROR: operator '()' accepting %d argument(s) is undefined for a class '%.*s'", arguments.size(), FMT_ISTR(value->type->name));

			return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, ctx.GetErrorType(), value, actualArguments);
		}
	}

	assert(type);

	if(type->isGeneric)
		Stop(ctx, source, "ERROR: generic function call is not supported");

	assert(actualArguments.size() == type->arguments.size());

	{
		ExprBase *actual = actualArguments.head;
		TypeHandle *expected = type->arguments.head;

		for(; actual && expected; actual = actual->next, expected = expected->next)
			assert(actual->type == expected->type);

		assert(actual == NULL);
		assert(expected == NULL);
	}

	return new (ctx.get<ExprFunctionCall>()) ExprFunctionCall(source, type->returnType, value, actualArguments);
}